

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_color.c
# Opt level: O2

void TIFFYCbCrtoRGB(TIFFYCbCrToRGB *ycbcr,uint32_t Y,int32_t Cb,int32_t Cr,uint32_t *r,uint32_t *g,
                   uint32_t *b)

{
  int32_t *piVar1;
  ulong uVar2;
  ulong uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)Y;
  if (0xfe < Y) {
    uVar6 = 0xff;
  }
  if (0xfe < Cb) {
    Cb = 0xff;
  }
  uVar3 = (ulong)(uint)Cb;
  if (Cb < 1) {
    uVar3 = 0;
  }
  if (0xfe < Cr) {
    Cr = 0xff;
  }
  uVar2 = (ulong)(uint)Cr;
  if (Cr < 1) {
    uVar2 = 0;
  }
  piVar1 = ycbcr->Y_tab;
  uVar4 = ycbcr->Cr_r_tab[uVar2] + piVar1[uVar6];
  if (0xfe < (int)uVar4) {
    uVar4 = 0xff;
  }
  uVar5 = 0;
  if ((int)uVar4 < 1) {
    uVar4 = uVar5;
  }
  *r = uVar4;
  uVar4 = (ycbcr->Cr_g_tab[uVar2] + ycbcr->Cb_g_tab[uVar3] >> 0x10) + piVar1[uVar6];
  if (0xfe < (int)uVar4) {
    uVar4 = 0xff;
  }
  if ((int)uVar4 < 1) {
    uVar4 = uVar5;
  }
  *g = uVar4;
  uVar4 = ycbcr->Cb_b_tab[uVar3] + piVar1[uVar6];
  if (0xfe < (int)uVar4) {
    uVar4 = 0xff;
  }
  if ((int)uVar4 < 1) {
    uVar4 = uVar5;
  }
  *b = uVar4;
  return;
}

Assistant:

void TIFFYCbCrtoRGB(TIFFYCbCrToRGB *ycbcr, uint32_t Y, int32_t Cb, int32_t Cr,
                    uint32_t *r, uint32_t *g, uint32_t *b)
{
    int32_t i;

    /* XXX: Only 8-bit YCbCr input supported for now */
    Y = HICLAMP(Y, 255);
    Cb = CLAMP(Cb, 0, 255);
    Cr = CLAMP(Cr, 0, 255);

    i = ycbcr->Y_tab[Y] + ycbcr->Cr_r_tab[Cr];
    *r = CLAMP(i, 0, 255);
    i = ycbcr->Y_tab[Y] +
        (int)((ycbcr->Cb_g_tab[Cb] + ycbcr->Cr_g_tab[Cr]) >> SHIFT);
    *g = CLAMP(i, 0, 255);
    i = ycbcr->Y_tab[Y] + ycbcr->Cb_b_tab[Cb];
    *b = CLAMP(i, 0, 255);
}